

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>_>
* __thiscall
tinyusdz::usdc::USDCReader::Impl::DecodeListOp<tinyusdz::Payload>
          (vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>_>
           *__return_storage_ptr__,Impl *this,ListOp<tinyusdz::Payload> *arg)

{
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *__x;
  pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (arg->is_explicit == true) {
    __x = &arg->explicit_items;
    local_38.first = ResetToExplicit;
  }
  else {
    if ((arg->explicit_items).
        super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (arg->explicit_items).
        super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_38.first = ResetToExplicit;
      std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_38.second,
                 (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                 &arg->explicit_items);
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
      ::
      emplace_back<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>
                ((vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
                  *)__return_storage_ptr__,&local_38);
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                (&local_38.second);
    }
    if ((arg->added_items).super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (arg->added_items).super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_38.first = Add;
      std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_38.second,
                 (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&arg->added_items)
      ;
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
      ::
      emplace_back<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>
                ((vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
                  *)__return_storage_ptr__,&local_38);
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                (&local_38.second);
    }
    if ((arg->appended_items).
        super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (arg->appended_items).
        super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_38.first = Append;
      std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_38.second,
                 (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                 &arg->appended_items);
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
      ::
      emplace_back<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>
                ((vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
                  *)__return_storage_ptr__,&local_38);
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                (&local_38.second);
    }
    if ((arg->deleted_items).
        super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (arg->deleted_items).
        super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_38.first = Delete;
      std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_38.second,
                 (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                 &arg->deleted_items);
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
      ::
      emplace_back<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>
                ((vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
                  *)__return_storage_ptr__,&local_38);
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                (&local_38.second);
    }
    if ((arg->prepended_items).
        super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (arg->prepended_items).
        super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_38.first = Prepend;
      std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_38.second,
                 (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                 &arg->prepended_items);
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
      ::
      emplace_back<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>
                ((vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
                  *)__return_storage_ptr__,&local_38);
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                (&local_38.second);
    }
    if ((arg->ordered_items).
        super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (arg->ordered_items).
        super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
        super__Vector_impl_data._M_start) {
      return __return_storage_ptr__;
    }
    __x = &arg->ordered_items;
    local_38.first = Order;
  }
  std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::vector
            ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_38.second,
             (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)__x);
  ::std::
  vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
  ::
  emplace_back<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>
            ((vector<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>,std::allocator<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>>
              *)__return_storage_ptr__,&local_38);
  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector(&local_38.second);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<ListEditQual, std::vector<T>>>
USDCReader::Impl::DecodeListOp(const ListOp<T> &arg) {
  std::vector<std::pair<ListEditQual, std::vector<T>>> dst;

  if (arg.IsExplicit()) {  // fast path
    dst.push_back({ListEditQual::ResetToExplicit, arg.GetExplicitItems()});
  } else {
    // Assume all items have same ListEdit qualifier.
    if (arg.GetExplicitItems().size()) {
      dst.push_back({ListEditQual::ResetToExplicit, arg.GetExplicitItems()});
    }
    if (arg.GetAddedItems().size()) {
      dst.push_back({ListEditQual::Add, arg.GetAddedItems()});
    }
    if (arg.GetAppendedItems().size()) {
      dst.push_back({ListEditQual::Append, arg.GetAppendedItems()});
    }
    if (arg.GetDeletedItems().size()) {
      dst.push_back({ListEditQual::Delete, arg.GetDeletedItems()});
    }
    if (arg.GetPrependedItems().size()) {
      dst.push_back({ListEditQual::Prepend, arg.GetPrependedItems()});
    }
    if (arg.GetOrderedItems().size()) {
      dst.push_back({ListEditQual::Order, arg.GetOrderedItems()});
    }
  }

  return dst;
}